

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

FT_Error ps_table_add(PS_Table table,FT_Int idx,void *object,FT_UInt length)

{
  ulong uVar1;
  FT_Error FVar2;
  ulong uVar3;
  FT_Byte *pFVar4;
  FT_Byte *pFVar5;
  ulong new_size;
  ulong uVar6;
  FT_Offset FVar7;
  ulong uVar8;
  ulong __n;
  
  FVar2 = 6;
  if ((-1 < idx) && (idx < table->max_elems)) {
    pFVar4 = table->block;
    FVar7 = table->cursor;
    __n = (ulong)length;
    uVar1 = table->capacity;
    if (uVar1 < FVar7 + __n) {
      uVar6 = (long)object - (long)pFVar4;
      new_size = uVar1;
      uVar3 = 0xffffffffffffffff;
      if (-1 < (long)uVar6) {
        uVar3 = uVar6;
      }
      do {
        new_size = new_size + (new_size >> 2) + 0x400 & 0xfffffffffffffc00;
      } while (new_size < FVar7 + __n);
      uVar8 = 0xffffffffffffffff;
      if (uVar6 < uVar1) {
        uVar8 = uVar3;
      }
      FVar2 = ps_table_realloc(table,new_size);
      if ((FVar2 == 0) && (-1 < (long)uVar8)) {
        object = table->block + uVar8;
      }
      else if (FVar2 != 0) {
        return FVar2;
      }
      pFVar4 = table->block;
      FVar7 = table->cursor;
    }
    pFVar5 = pFVar4 + FVar7;
    if (pFVar4 == (FT_Byte *)0x0) {
      pFVar5 = (FT_Byte *)0x0;
    }
    table->elements[(uint)idx] = pFVar5;
    table->lengths[(uint)idx] = length;
    memcpy(table->block + FVar7,object,__n);
    table->cursor = table->cursor + __n;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_table_add( PS_Table     table,
                FT_Int       idx,
                const void*  object,
                FT_UInt      length )
  {
    if ( idx < 0 || idx >= table->max_elems )
    {
      FT_ERROR(( "ps_table_add: invalid index\n" ));
      return FT_THROW( Invalid_Argument );
    }

    /* grow the base block if needed */
    if ( table->cursor + length > table->capacity )
    {
      FT_Error    error;
      FT_Offset   new_size = table->capacity;
      FT_PtrDist  in_offset;


      in_offset = (FT_Byte*)object - table->block;
      if ( in_offset < 0 || (FT_Offset)in_offset >= table->capacity )
        in_offset = -1;

      while ( new_size < table->cursor + length )
      {
        /* increase size by 25% and round up to the nearest multiple
           of 1024 */
        new_size += ( new_size >> 2 ) + 1;
        new_size  = FT_PAD_CEIL( new_size, 1024 );
      }

      error = ps_table_realloc( table, new_size );
      if ( error )
        return error;

      if ( in_offset >= 0 )
        object = table->block + in_offset;
    }

    /* add the object to the base block and adjust offset */
    table->elements[idx] = FT_OFFSET( table->block, table->cursor );
    table->lengths [idx] = length;
    FT_MEM_COPY( table->block + table->cursor, object, length );

    table->cursor += length;
    return FT_Err_Ok;
  }